

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ustar_filenames.c
# Opt level: O0

void test_ustar_filenames(void)

{
  int iVar1;
  int flen;
  int dlen;
  int in_stack_00002368;
  int in_stack_0000236c;
  char *in_stack_00002370;
  undefined4 local_8;
  
  for (iVar1 = 5; iVar1 < 0x46; iVar1 = iVar1 + 5) {
    for (local_8 = 0x5f - iVar1; local_8 < 0x69 - iVar1; local_8 = local_8 + 1) {
      test_filename(in_stack_00002370,in_stack_0000236c,in_stack_00002368);
      test_filename(in_stack_00002370,in_stack_0000236c,in_stack_00002368);
    }
  }
  for (local_8 = 0x5a; local_8 < 0x6e; local_8 = local_8 + 1) {
    test_filename(in_stack_00002370,in_stack_0000236c,in_stack_00002368);
    test_filename(in_stack_00002370,in_stack_0000236c,in_stack_00002368);
  }
  return;
}

Assistant:

DEFINE_TEST(test_ustar_filenames)
{
	int dlen, flen;

	/* Try a bunch of different file/dir lengths that add up
	 * to just a little less or a little more than 100 bytes.
	 * This exercises the code that splits paths between ustar
	 * filename and prefix fields.
	 */
	for (dlen = 5; dlen < 70; dlen += 5) {
		for (flen = 100 - dlen - 5; flen < 100 - dlen + 5; flen++) {
			test_filename(NULL, dlen, flen);
			test_filename("/", dlen, flen);
		}
	}

	/* Probe the 100-char limit for paths with no '/'. */
	for (flen = 90; flen < 110; flen++) {
		test_filename(NULL, 0, flen);
		test_filename("/", dlen, flen);
	}

	/* XXXX TODO Probe the 100-char limit with a dir prefix. */
	/* XXXX TODO Probe the 255-char total limit. */
}